

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_2019::DataTransform<short,_int>::Run
          (DataTransform<short,_int> *this,istream *input_stream)

{
  uint uVar1;
  NumericType NVar2;
  WarningType WVar3;
  uint uVar4;
  ostream *poVar5;
  size_t *__idx;
  uint data_to_write;
  int iVar6;
  bool bVar7;
  ushort in_FPUControlWord;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  double dVar8;
  short input_data;
  ushort local_266;
  short local_264;
  allocator local_261;
  istream *local_260;
  string *local_258;
  string local_250;
  string word;
  char buffer [128];
  
  local_258 = &this->print_format_;
  iVar6 = 0;
  local_260 = input_stream;
  do {
    if (this->is_ascii_input_ == true) {
      word._M_dataplus._M_p = (pointer)&word.field_2;
      word._M_string_length = 0;
      word.field_2._M_local_buf[0] = '\0';
      std::operator>>(local_260,(string *)&word);
      bVar7 = word._M_string_length == 0;
      if (!bVar7) {
        std::__cxx11::stold((longdouble *)&word,(string *)0x0,__idx);
        local_266 = in_FPUControlWord | 0xc00;
        input_data = (short)ROUND(in_ST0);
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
        local_264 = input_data;
      }
      std::__cxx11::string::~string((string *)&word);
      if (!bVar7) goto LAB_00114e53;
      if (bVar7) {
        if (!bVar7) {
          return false;
        }
        goto LAB_00114fe6;
      }
    }
    else {
      bVar7 = sptk::ReadStream<short>(&input_data,local_260);
      if (!bVar7) {
LAB_00114fe6:
        if (this->is_ascii_output_ != true) {
          return true;
        }
        if (iVar6 % this->num_column_ != 0) {
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          return true;
        }
        return true;
      }
LAB_00114e53:
      uVar4 = (uint)input_data;
      data_to_write = this->minimum_value_;
      uVar1 = this->maximum_value_;
      if ((int)data_to_write < (int)uVar1) {
        NVar2 = this->input_numeric_type_;
        if (NVar2 == kFloatingPoint) {
          if (((int)data_to_write <= (int)uVar4) &&
             (data_to_write = uVar1, (int)uVar4 <= (int)uVar1)) goto LAB_00114eb1;
        }
        else if (NVar2 == kUnsignedInteger) {
          if (data_to_write <= uVar4) {
            bVar7 = uVar1 < uVar4;
            data_to_write = uVar1;
            if (!bVar7) {
              data_to_write = uVar4;
            }
            goto LAB_00114eb6;
          }
        }
        else {
          if (NVar2 != kSignedInteger) goto LAB_00114eb1;
          if ((int)data_to_write <= (int)uVar4) {
            bVar7 = (int)uVar1 < (int)uVar4;
            data_to_write = uVar1;
            if ((int)uVar4 <= (int)uVar1) {
              data_to_write = uVar4;
            }
            goto LAB_00114eb6;
          }
        }
LAB_00114ed7:
        if (this->warning_type_ != kIgnore) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&word);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&word,iVar6);
          std::operator<<(poVar5,"th data is over the range of output type");
          std::__cxx11::string::string((string *)&local_250,"x2x",&local_261);
          sptk::PrintErrorMessage(&local_250,(ostringstream *)&word);
          std::__cxx11::string::~string((string *)&local_250);
          WVar3 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&word);
          if (WVar3 == kExit) {
            return false;
          }
        }
      }
      else {
LAB_00114eb1:
        bVar7 = false;
        data_to_write = uVar4;
LAB_00114eb6:
        if ((bVar7) || (this->rounding_ == false)) {
          if (bVar7) goto LAB_00114ed7;
        }
        else {
          if (input_data < 1) {
            dVar8 = (double)(int)uVar4 + -0.5;
          }
          else {
            dVar8 = (double)(int)uVar4 + 0.5;
          }
          data_to_write = (uint)dVar8;
        }
      }
      if (this->is_ascii_output_ == true) {
        bVar7 = sptk::SnPrintf<int>(data_to_write,local_258,0x80,buffer);
        if (!bVar7) {
          return false;
        }
        std::operator<<((ostream *)&std::cout,buffer);
        if ((iVar6 + 1) % this->num_column_ == 0) {
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        }
        else {
          std::operator<<((ostream *)&std::cout,"\t");
        }
      }
      else {
        bVar7 = sptk::WriteStream<int>(data_to_write,(ostream *)&std::cout);
        if (!bVar7) {
          return false;
        }
      }
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }